

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KcpTcpEventLoop.cpp
# Opt level: O2

void __thiscall sznet::net::KcpTcpEventLoop::handleNewUdpMessage(KcpTcpEventLoop *this)

{
  key_type *__k;
  sockaddr_in *psVar1;
  undefined8 uVar2;
  InetAddress addr;
  int v;
  undefined2 uVar3;
  undefined2 uVar4;
  undefined4 uVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  int32_t secretId;
  iterator iVar10;
  iterator iVar11;
  iterator iVar12;
  KcpConnection *this_00;
  __shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *p_Var13;
  self *psVar14;
  LogStream *this_01;
  bool isSuccess;
  SourceFile file;
  SourceFile file_00;
  undefined1 local_10b8 [8];
  char buf [256];
  _Bind<void_(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>
  local_e0;
  undefined1 local_c8 [12];
  undefined1 local_b8 [12];
  undefined8 local_a8;
  undefined4 uStack_a0;
  undefined4 uStack_9c;
  undefined4 uStack_98;
  undefined8 uStack_94;
  anon_union_28_2_62076933_for_InetAddress_1 local_88;
  undefined1 local_68 [8];
  string connName;
  KcpConnectionPtr kcpConn;
  uint32_t conv;
  
  EventLoop::assertInLoopThread(&this->super_EventLoop);
  if ((this->m_inputBuffer).m_writerIndex - (this->m_inputBuffer).m_readerIndex != 8) {
    Logger::SourceFile::SourceFile<106>
              ((SourceFile *)local_c8,
               (char (*) [106])
               "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
              );
    file._12_4_ = 0;
    file.m_data = (char *)local_c8._0_8_;
    file.m_size = local_c8._8_4_;
    Logger::Logger((Logger *)local_10b8,file,0xa4,ERROR);
    psVar14 = LogStream::operator<<((LogStream *)buf,"who are you! from ");
    local_88._0_2_ = (this->m_curRecvAddr).sin_family;
    local_88._2_2_ = (this->m_curRecvAddr).sin_port;
    local_88._4_4_ = (this->m_curRecvAddr).sin_addr;
    local_88.m_addr.sin_zero = (uchar  [8])*(undefined8 *)(this->m_curRecvAddr).sin_zero;
    InetAddress::toIpPort_abi_cxx11_((string *)local_68,(InetAddress *)&local_88.m_addr);
    LogStream::operator<<(psVar14,(string *)local_68);
    std::__cxx11::string::~string((string *)local_68);
    Logger::~Logger((Logger *)local_10b8);
    return;
  }
  kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._4_4_ = Buffer::readInt32(&this->m_inputBuffer);
  __k = (key_type *)
        ((long)&kcpConn.super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi + 4);
  secretId = Buffer::readInt32(&this->m_inputBuffer);
  iVar10 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::TcpConnection>_>_>_>
           ::find(&(this->m_tcpConnections)._M_t,__k);
  iVar11 = std::
           _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_int>,_std::_Select1st<std::pair<const_unsigned_int,_int>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_int>_>_>
           ::find(&(this->m_crypts)._M_t,__k);
  if ((_Rb_tree_header *)iVar10._M_node ==
      &(this->m_tcpConnections)._M_t._M_impl.super__Rb_tree_header) {
    v = 1;
  }
  else if (*(int *)((long)&iVar10._M_node[1]._M_parent[1]._M_right + 4) == 2) {
    if ((_Rb_tree_header *)iVar11._M_node == &(this->m_crypts)._M_t._M_impl.super__Rb_tree_header) {
      v = 3;
    }
    else {
      if (*(int *)&iVar11._M_node[1].field_0x4 == secretId) {
        iVar12 = std::
                 _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::_Select1st<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
                 ::find(&(this->m_kcpConnections)._M_t,
                        (key_type *)
                        ((long)&kcpConn.
                                super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                ._M_refcount._M_pi + 4));
        isSuccess = true;
        if ((_Rb_tree_header *)iVar12._M_node ==
            &(this->m_kcpConnections)._M_t._M_impl.super__Rb_tree_header) {
          InetAddress::toIpPort_abi_cxx11_((string *)local_68,&this->m_udpLisetenAddr);
          snprintf(local_10b8,0x100,"-kcp-%s#%d",local_68,
                   (ulong)kcpConn.
                          super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi._4_4_);
          std::__cxx11::string::~string((string *)local_68);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_68,&this->m_name,local_10b8);
          this_00 = (KcpConnection *)operator_new(0x1f0);
          KcpConnection::KcpConnection
                    (this_00,&this->super_EventLoop,(this->m_udpSocket).m_sockfd,secretId,
                     (string *)local_68,
                     kcpConn.
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi._4_4_,false,this->m_kcpMode);
          std::__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2>::
          __shared_ptr<sznet::net::KcpConnection,void>
                    ((__shared_ptr<sznet::net::KcpConnection,(__gnu_cxx::_Lock_policy)2> *)
                     (connName.field_2._M_local_buf + 8),this_00);
          *(undefined4 *)(connName.field_2._8_8_ + 0x44) = 3;
          psVar1 = &this->m_curRecvAddr;
          local_a8._0_2_ = psVar1->sin_family;
          local_a8._2_2_ = psVar1->sin_port;
          local_a8._4_4_ = psVar1->sin_addr;
          uVar2 = *(undefined8 *)(this->m_curRecvAddr).sin_zero;
          uVar3 = psVar1->sin_family;
          uVar4 = psVar1->sin_port;
          uVar5 = psVar1->sin_addr;
          uVar6 = psVar1->sin_zero[0];
          uVar7 = psVar1->sin_zero[1];
          uVar8 = psVar1->sin_zero[2];
          uVar9 = psVar1->sin_zero[3];
          addr.field_0.m_addr.sin_zero[3] = uVar9;
          addr.field_0.m_addr.sin_zero[2] = uVar8;
          addr.field_0.m_addr.sin_zero[1] = uVar7;
          addr.field_0.m_addr.sin_zero[0] = uVar6;
          addr.field_0.m_addr.sin_addr.s_addr = (in_addr)(in_addr)uVar5;
          addr.field_0.m_addr.sin_port = uVar4;
          addr.field_0.m_addr.sin_family = uVar3;
          uStack_a0 = (undefined4)uVar2;
          uStack_9c = (undefined4)((ulong)uVar2 >> 0x20);
          addr.field_0._12_4_ = uStack_9c;
          addr.field_0._16_4_ = uStack_98;
          addr.field_0._20_8_ = uStack_94;
          KcpConnection::setPeerAddr((KcpConnection *)connName.field_2._8_8_,addr);
          KcpConnection::newKCP((KcpConnection *)connName.field_2._8_8_);
          p_Var13 = &std::
                     map<unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<sznet::net::KcpConnection>_>_>_>
                     ::operator[](&this->m_kcpConnections,
                                  (key_type *)
                                  ((long)&kcpConn.
                                          super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 4))->
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (p_Var13,(__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                             ((long)&connName.field_2 + 8));
          std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
                    ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)> *)
                     (connName.field_2._8_8_ + 0x50),&this->m_kcpConnectionCallback);
          std::
          function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
          ::operator=((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_sznet::net::Buffer_*,_sznet::Timestamp)>
                       *)(connName.field_2._8_8_ + 0x70),&this->m_kcpMessageCallback);
          std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)>::operator=
                    ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&)> *)
                     (connName.field_2._8_8_ + 0x90),&this->m_kcpWriteCompleteCallback);
          local_e0._M_f = (offset_in_KcpTcpEventLoop_to_subr)removeKcpConnectionInLoop;
          local_e0._8_8_ = 0;
          local_e0._M_bound_args.
          super__Tuple_impl<0UL,_sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
          .super__Head_base<0UL,_sznet::net::KcpTcpEventLoop_*,_false>._M_head_impl =
               (_Tuple_impl<0UL,_sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                )(_Tuple_impl<0UL,_sznet::net::KcpTcpEventLoop_*,_std::_Placeholder<1>,_std::_Placeholder<2>_>
                  )this;
          std::function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)>::
          function<std::_Bind<void(sznet::net::KcpTcpEventLoop::*(sznet::net::KcpTcpEventLoop*,std::_Placeholder<1>,std::_Placeholder<2>))(std::shared_ptr<sznet::net::KcpConnection>const&,int)>,void>
                    ((function<void(std::shared_ptr<sznet::net::KcpConnection>const&,int)> *)
                     &local_88.m_addr,&local_e0);
          std::function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)>::operator=
                    ((function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
                     (connName.field_2._8_8_ + 0xd0),
                     (function<void_(const_std::shared_ptr<sznet::net::KcpConnection>_&,_int)> *)
                     &local_88.m_addr);
          std::_Function_base::~_Function_base((_Function_base *)&local_88.m_addr);
          p_Var13 = &std::__detail::
                     _Map_base<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                     ::operator[]((_Map_base<sockaddr_in,_std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>,_std::allocator<std::pair<const_sockaddr_in,_std::shared_ptr<sznet::net::KcpConnection>_>_>,_std::__detail::_Select1st,_sznet::net::KcpTcpEventLoop::sockaddrInKeyEqual,_sznet::net::KcpTcpEventLoop::sockaddrInKeyHash,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                   *)&this->m_addrConns,&this->m_curRecvAddr)->
                     super___shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>;
          std::__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (p_Var13,(__shared_ptr<sznet::net::KcpConnection,_(__gnu_cxx::_Lock_policy)2> *)
                             ((long)&connName.field_2 + 8));
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&kcpConn);
          std::__cxx11::string::~string((string *)local_68);
        }
        goto LAB_0013ea37;
      }
      v = 4;
    }
  }
  else {
    v = 2;
  }
  Logger::SourceFile::SourceFile<106>
            ((SourceFile *)local_b8,
             (char (*) [106])
             "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/net/KcpTcpEventLoop.cpp"
            );
  file_00._12_4_ = 0;
  file_00.m_data = (char *)local_b8._0_8_;
  file_00.m_size = local_b8._8_4_;
  Logger::Logger((Logger *)local_10b8,file_00,0xd0,ERROR);
  psVar14 = LogStream::operator<<((LogStream *)buf,"you are hack! [");
  this_01 = LogStream::operator<<(psVar14,v);
  psVar14 = LogStream::operator<<(this_01,"] from ");
  local_88._0_2_ = (this->m_curRecvAddr).sin_family;
  local_88._2_2_ = (this->m_curRecvAddr).sin_port;
  local_88._4_4_ = (this->m_curRecvAddr).sin_addr;
  local_88.m_addr.sin_zero = (uchar  [8])*(undefined8 *)(this->m_curRecvAddr).sin_zero;
  InetAddress::toIpPort_abi_cxx11_((string *)local_68,(InetAddress *)&local_88.m_addr);
  LogStream::operator<<(psVar14,(string *)local_68);
  std::__cxx11::string::~string((string *)local_68);
  Logger::~Logger((Logger *)local_10b8);
  isSuccess = false;
LAB_0013ea37:
  checkResponse(this,isSuccess);
  return;
}

Assistant:

void KcpTcpEventLoop::handleNewUdpMessage()
{
	assertInLoopThread();
	size_t recvSize = m_inputBuffer.readableBytes();
	if (recvSize != (sizeof(uint32_t) + sizeof(int32_t)))
	{
		// 这种情况不予理会
		LOG_ERROR << "who are you! from " << InetAddress(m_curRecvAddr).toIpPort();
		return;
	}
	uint32_t conv = static_cast<uint32_t>(m_inputBuffer.readInt32());
	int32_t secretId = m_inputBuffer.readInt32();
	bool ok = true;
	int inError = 0;
	TcpConnectionMap::iterator fTcpIter = m_tcpConnections.find(conv);
	cryptConvMap::iterator fSecretIter = m_crypts.find(conv);
	do
	{
		if (fTcpIter == m_tcpConnections.end())
		{
			ok = false;
			inError = 1;
			break;
		}

		if (!fTcpIter->second->connected())
		{
			ok = false;
			inError = 2;
			break;
		}

		if (fSecretIter == m_crypts.end())
		{
			ok = false;
			inError = 3;
			break;
		}

		if (fSecretIter->second != secretId)
		{
			ok = false;
			inError = 4;
			break;
		}

		inError = 0;
		ok = true;
	} while (false);
	if (!ok)
	{
		LOG_ERROR << "you are hack! [" << inError << "] from " << InetAddress(m_curRecvAddr).toIpPort();
		// 回执客户端
		checkResponse(ok);
		return;
	}
	KcpConnectionMap::iterator fKcpIter = m_kcpConnections.find(conv);
	if (fKcpIter == m_kcpConnections.end())
	{
		// 创建KcpConnection
		char buf[256];
		snprintf(buf, sizeof(buf), "-kcp-%s#%d", getUdpListenIpPort().c_str(), conv);
		string connName = m_name + buf;
		KcpConnectionPtr kcpConn(new KcpConnection(this, m_udpSocket.fd(), secretId, connName, conv, false, m_kcpMode));
		kcpConn->setState(KcpConnection::StateE::kConnecting);
		kcpConn->setPeerAddr(InetAddress(m_curRecvAddr));
		kcpConn->newKCP();
		m_kcpConnections[conv] = kcpConn;
		kcpConn->setKcpConnectionCallback(m_kcpConnectionCallback);
		kcpConn->setKcpMessageCallback(m_kcpMessageCallback);
		kcpConn->setKcpWriteCompleteCallback(m_kcpWriteCompleteCallback);
		kcpConn->setKcpCloseCallback(std::bind(&KcpTcpEventLoop::removeKcpConnectionInLoop, this, std::placeholders::_1, std::placeholders::_2));
		// 映射
		m_addrConns[m_curRecvAddr] = kcpConn;
	}
	checkResponse(ok);
}